

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O2

int check_router_keys(rtr_signature_seg *sig_segs,spki_table *table)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  uint router_keys_len;
  spki_record *tmp_key;
  char ski_str [61];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tmp_key = (spki_record *)0x0;
  iVar3 = -1;
  do {
    if (sig_segs == (rtr_signature_seg *)0x0) {
      iVar3 = 0;
LAB_00112091:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return iVar3;
      }
      __stack_chk_fail();
    }
    router_keys_len = 0;
    iVar2 = spki_table_search_by_ski(table,sig_segs->ski,&tmp_key,&router_keys_len);
    if (iVar2 == -1) goto LAB_00112091;
    if (router_keys_len == 0) {
      ski_str[0x30] = '\0';
      ski_str[0x31] = '\0';
      ski_str[0x32] = '\0';
      ski_str[0x33] = '\0';
      ski_str[0x34] = '\0';
      ski_str[0x35] = '\0';
      ski_str[0x36] = '\0';
      ski_str[0x37] = '\0';
      ski_str[0x38] = '\0';
      ski_str[0x39] = '\0';
      ski_str[0x3a] = '\0';
      ski_str[0x3b] = '\0';
      ski_str[0x3c] = '\0';
      ski_str[0x20] = '\0';
      ski_str[0x21] = '\0';
      ski_str[0x22] = '\0';
      ski_str[0x23] = '\0';
      ski_str[0x24] = '\0';
      ski_str[0x25] = '\0';
      ski_str[0x26] = '\0';
      ski_str[0x27] = '\0';
      ski_str[0x28] = '\0';
      ski_str[0x29] = '\0';
      ski_str[0x2a] = '\0';
      ski_str[0x2b] = '\0';
      ski_str[0x2c] = '\0';
      ski_str[0x2d] = '\0';
      ski_str[0x2e] = '\0';
      ski_str[0x2f] = '\0';
      ski_str[0x10] = '\0';
      ski_str[0x11] = '\0';
      ski_str[0x12] = '\0';
      ski_str[0x13] = '\0';
      ski_str[0x14] = '\0';
      ski_str[0x15] = '\0';
      ski_str[0x16] = '\0';
      ski_str[0x17] = '\0';
      ski_str[0x18] = '\0';
      ski_str[0x19] = '\0';
      ski_str[0x1a] = '\0';
      ski_str[0x1b] = '\0';
      ski_str[0x1c] = '\0';
      ski_str[0x1d] = '\0';
      ski_str[0x1e] = '\0';
      ski_str[0x1f] = '\0';
      ski_str[0] = '\0';
      ski_str[1] = '\0';
      ski_str[2] = '\0';
      ski_str[3] = '\0';
      ski_str[4] = '\0';
      ski_str[5] = '\0';
      ski_str[6] = '\0';
      ski_str[7] = '\0';
      ski_str[8] = '\0';
      ski_str[9] = '\0';
      ski_str[10] = '\0';
      ski_str[0xb] = '\0';
      ski_str[0xc] = '\0';
      ski_str[0xd] = '\0';
      ski_str[0xe] = '\0';
      ski_str[0xf] = '\0';
      ski_to_char(ski_str,sig_segs->ski);
      lrtr_dbg("BGPSEC: ERROR: Could not find router key for SKI: %s",ski_str);
      iVar3 = -4;
      goto LAB_00112091;
    }
    lrtr_free(tmp_key);
    sig_segs = sig_segs->next;
  } while( true );
}

Assistant:

int check_router_keys(const struct rtr_signature_seg *sig_segs, struct spki_table *table)
{
	struct spki_record *tmp_key = NULL;
	const struct rtr_signature_seg *curr = sig_segs;

	while (curr) {
		unsigned int router_keys_len = 0;
		enum spki_rtvals spki_retval =
			spki_table_search_by_ski(table, (uint8_t *)curr->ski, &tmp_key, &router_keys_len);
		if (spki_retval == SPKI_ERROR)
			return RTR_BGPSEC_ERROR;

		/* Return an error, if a router key was not found. */
		if (router_keys_len == 0) {
			char ski_str[SKI_STR_LEN] = {0};

			ski_to_char(ski_str, (uint8_t *)curr->ski);
			BGPSEC_DBG("ERROR: Could not find router key for SKI: %s", ski_str);
			return RTR_BGPSEC_ROUTER_KEY_NOT_FOUND;
		}
		lrtr_free(tmp_key);
		curr = curr->next;
	}

	return RTR_BGPSEC_SUCCESS;
}